

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_decimal<unsigned_long_long>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,unsigned_long_long value)

{
  undefined2 uVar1;
  buffer<wchar_t> *pbVar2;
  size_t sVar3;
  wchar_t *pwVar4;
  bool bVar5;
  long lVar6;
  undefined1 *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 uVar12;
  undefined1 auVar11 [16];
  undefined1 auStack_c8 [160];
  
  lVar6 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  uVar8 = ((uint)lVar6 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar9 = (ulong)((uVar8 - (value < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                              (ulong)uVar8 * 8))) + 1);
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar10 = sVar3 + uVar9;
  if (pbVar2->capacity_ < uVar10) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar10);
  }
  pbVar2->size_ = uVar10;
  puVar7 = auStack_c8 + uVar9 * 4;
  uVar10 = value;
  if (99 < value) {
    do {
      value = uVar10 / 100;
      uVar1 = *(undefined2 *)
               (basic_data<void>::digits + (ulong)(uint)((int)uVar10 + (int)value * -100) * 2);
      uVar12 = (undefined1)((ushort)uVar1 >> 8);
      auVar11 = ZEXT416(CONCAT22((short)(CONCAT13(uVar12,CONCAT12(uVar12,uVar1)) >> 0x10),
                                 CONCAT11((char)uVar1,(char)uVar1)));
      auVar11 = pshuflw(auVar11,auVar11,0x60);
      *(ulong *)(puVar7 + -8) = CONCAT44(auVar11._4_4_ >> 0x18,auVar11._0_4_ >> 0x18);
      puVar7 = puVar7 + -8;
      bVar5 = 9999 < uVar10;
      uVar10 = value;
    } while (bVar5);
  }
  pwVar4 = pbVar2->ptr_;
  if (value < 10) {
    uVar8 = (uint)value | 0x30;
    lVar6 = -4;
  }
  else {
    *(int *)(puVar7 + -4) =
         (int)(char)basic_data<void>::digits[((value & 0xffffffff) * 2 & 0xffffffff) + 1];
    uVar8 = (uint)(char)basic_data<void>::digits[(value & 0xffffffff) * 2];
    lVar6 = -8;
  }
  *(uint *)(puVar7 + lVar6) = uVar8;
  if (uVar9 != 0) {
    memcpy(pwVar4 + sVar3,auStack_c8,uVar9 << 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }